

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRelativePathCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pbVar1;
  bool bVar2;
  char *in_RCX;
  string res;
  allocator local_41;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x80) {
    bVar2 = cmsys::SystemTools::FileIsFullPath(pbVar1[2]._M_dataplus._M_p);
    if (bVar2) {
      __rhs = pbVar1 + 3;
      bVar2 = cmsys::SystemTools::FileIsFullPath((__rhs->_M_dataplus)._M_p);
      if (bVar2) {
        cmSystemTools::RelativePath_abi_cxx11_
                  (&local_40,(cmSystemTools *)pbVar1[2]._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,
                   in_RCX);
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,pbVar1 + 1,local_40._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_40);
        return true;
      }
      std::operator+(&local_40,"RELATIVE_PATH must be passed a full path to the file: ",__rhs);
      cmCommand::SetError(&this->super_cmCommand,&local_40);
    }
    else {
      std::operator+(&local_40,"RELATIVE_PATH must be passed a full path to the directory: ",
                     pbVar1 + 2);
      cmCommand::SetError(&this->super_cmCommand,&local_40);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"RELATIVE_PATH called with incorrect number of arguments",
               &local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool cmFileCommand::HandleRelativePathCommand(
  std::vector<std::string> const& args)
{
  if (args.size() != 4) {
    this->SetError("RELATIVE_PATH called with incorrect number of arguments");
    return false;
  }

  const std::string& outVar = args[1];
  const std::string& directoryName = args[2];
  const std::string& fileName = args[3];

  if (!cmSystemTools::FileIsFullPath(directoryName.c_str())) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the directory: " +
      directoryName;
    this->SetError(errstring);
    return false;
  }
  if (!cmSystemTools::FileIsFullPath(fileName.c_str())) {
    std::string errstring =
      "RELATIVE_PATH must be passed a full path to the file: " + fileName;
    this->SetError(errstring);
    return false;
  }

  std::string res =
    cmSystemTools::RelativePath(directoryName.c_str(), fileName.c_str());
  this->Makefile->AddDefinition(outVar, res.c_str());
  return true;
}